

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

word * Gia_ObjComputeTruthTable(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Wrd_t *pVVar6;
  Gia_Obj_t *pGVar7;
  word *pwVar8;
  bool bVar9;
  bool local_d1;
  ulong *local_b0;
  word *local_98;
  Gia_Obj_t *local_68;
  int local_4c;
  ulong *puStack_48;
  int i;
  word *pTruth1;
  word *pTruth0;
  word *pTruthL;
  word *pTruth;
  Gia_Obj_t *pRoot;
  Gia_Obj_t *pTemp;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (p->vTtMemory == (Vec_Wrd_t *)0x0) {
    iVar1 = Gia_ManPiNum(p);
    p->nTtVars = iVar1;
    iVar1 = Abc_Truth6WordNum(p->nTtVars);
    p->nTtWords = iVar1;
    iVar1 = Gia_ManObjNum(p);
    pVVar4 = Vec_IntStart(iVar1 + 1000);
    p->vTtNums = pVVar4;
    pVVar4 = Vec_IntAlloc(0x100);
    p->vTtNodes = pVVar4;
    iVar1 = Abc_MaxInt(6,p->nTtVars);
    pVVar5 = Vec_PtrAllocTruthTables(iVar1);
    p->vTtInputs = pVVar5;
    pVVar6 = Vec_WrdStart(p->nTtWords << 8);
    p->vTtMemory = pVVar6;
  }
  else {
    iVar1 = p->nTtVars;
    iVar2 = Gia_ManPiNum(p);
    if (iVar1 != iVar2) {
      __assert_fail("p->nTtVars == Gia_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                    ,0xf1,"word *Gia_ObjComputeTruthTable(Gia_Man_t *, Gia_Obj_t *)");
    }
  }
  iVar1 = Vec_IntSize(p->vTtNums);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 < iVar2) {
    pVVar4 = p->vTtNums;
    iVar1 = Gia_ManObjNum(p);
    Vec_IntFillExtra(pVVar4,iVar1,0);
  }
  iVar1 = Gia_ObjIsCo(pObj);
  local_68 = pObj;
  if (iVar1 != 0) {
    local_68 = Gia_ObjFanin0(pObj);
  }
  Gia_ObjCollectInternal(p,local_68);
  iVar2 = Vec_WrdSize(p->vTtMemory);
  iVar1 = p->nTtWords;
  iVar3 = Vec_IntSize(p->vTtNodes);
  if (iVar2 < iVar1 * (iVar3 + 2)) {
    pVVar6 = p->vTtMemory;
    iVar1 = p->nTtWords;
    iVar2 = Vec_IntSize(p->vTtNodes);
    Vec_WrdFillExtra(pVVar6,iVar1 * (iVar2 + 2),0);
  }
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vTtNodes);
    bVar9 = false;
    if (local_4c < iVar1) {
      iVar1 = Vec_IntEntry(p->vTtNodes,local_4c);
      pRoot = Gia_ManObj(p,iVar1);
      bVar9 = pRoot != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    *(ulong *)pRoot = *(ulong *)pRoot & 0xffffffffbfffffff;
    pTruthL = Gla_ObjTruthNode(p,pRoot);
    pwVar8 = pTruthL + p->nTtWords;
    pGVar7 = Gia_ObjFanin0(pRoot);
    iVar1 = Gia_ObjIsAnd(pGVar7);
    if (iVar1 == 0) {
      pGVar7 = Gia_ObjFanin0(pRoot);
      iVar1 = Gia_ObjCioId(pGVar7);
      local_98 = Gla_ObjTruthElem(p,iVar1);
    }
    else {
      pGVar7 = Gia_ObjFanin0(pRoot);
      local_98 = Gla_ObjTruthNode(p,pGVar7);
    }
    pTruth1 = local_98;
    pGVar7 = Gia_ObjFanin1(pRoot);
    iVar1 = Gia_ObjIsAnd(pGVar7);
    if (iVar1 == 0) {
      pGVar7 = Gia_ObjFanin1(pRoot);
      iVar1 = Gia_ObjCioId(pGVar7);
      local_b0 = Gla_ObjTruthElem(p,iVar1);
    }
    else {
      pGVar7 = Gia_ObjFanin1(pRoot);
      local_b0 = Gla_ObjTruthNode(p,pGVar7);
    }
    puStack_48 = local_b0;
    iVar1 = Gia_ObjFaninC0(pRoot);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninC1(pRoot);
      if (iVar1 == 0) {
        while (pTruthL < pwVar8) {
          *pTruthL = *pTruth1 & *puStack_48;
          puStack_48 = puStack_48 + 1;
          pTruth1 = pTruth1 + 1;
          pTruthL = pTruthL + 1;
        }
      }
      else {
        while (pTruthL < pwVar8) {
          *pTruthL = *pTruth1 & (*puStack_48 ^ 0xffffffffffffffff);
          puStack_48 = puStack_48 + 1;
          pTruth1 = pTruth1 + 1;
          pTruthL = pTruthL + 1;
        }
      }
    }
    else {
      iVar1 = Gia_ObjFaninC1(pRoot);
      if (iVar1 == 0) {
        while (pTruthL < pwVar8) {
          *pTruthL = (*pTruth1 ^ 0xffffffffffffffff) & *puStack_48;
          puStack_48 = puStack_48 + 1;
          pTruth1 = pTruth1 + 1;
          pTruthL = pTruthL + 1;
        }
      }
      else {
        while (pTruthL < pwVar8) {
          *pTruthL = (*pTruth1 ^ 0xffffffffffffffff) & (*puStack_48 ^ 0xffffffffffffffff);
          puStack_48 = puStack_48 + 1;
          pTruth1 = pTruth1 + 1;
          pTruthL = pTruthL + 1;
        }
      }
    }
    local_4c = local_4c + 1;
  }
  iVar1 = Gia_ObjIsConst0(local_68);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsPi(p,local_68);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(local_68);
      if (iVar1 == 0) {
        pTruthL = (word *)0x0;
      }
      else {
        pTruthL = Gla_ObjTruthNode(p,local_68);
      }
    }
    else {
      iVar1 = Gia_ObjCioId(local_68);
      pTruthL = Gla_ObjTruthElem(p,iVar1);
    }
  }
  else {
    pwVar8 = Gla_ObjTruthFree1(p);
    pTruthL = Gla_ObjTruthConst0(p,pwVar8);
  }
  pwVar8 = Gla_ObjTruthFree2(p);
  iVar1 = Gia_ObjIsCo(pObj);
  local_d1 = false;
  if (iVar1 != 0) {
    iVar1 = Gia_ObjFaninC0(pObj);
    local_d1 = iVar1 != 0;
  }
  pwVar8 = Gla_ObjTruthDup(p,pwVar8,pTruthL,(uint)local_d1);
  return pwVar8;
}

Assistant:

word * Gia_ObjComputeTruthTable( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pTemp, * pRoot;
    word * pTruth, * pTruthL, * pTruth0, * pTruth1;
    int i;
    if ( p->vTtMemory == NULL )
    {
        p->nTtVars   = Gia_ManPiNum( p );
        p->nTtWords  = Abc_Truth6WordNum( p->nTtVars );
        p->vTtNums   = Vec_IntStart( Gia_ManObjNum(p) + 1000 );
        p->vTtNodes  = Vec_IntAlloc( 256 );
        p->vTtInputs = Vec_PtrAllocTruthTables( Abc_MaxInt(6, p->nTtVars) );
        p->vTtMemory = Vec_WrdStart( p->nTtWords * 256 );
    }
    else
    {
        // make sure the number of primary inputs did not change 
        // since the truth table computation storage was prepared
        assert( p->nTtVars == Gia_ManPiNum(p) );
    }
    // extend ID numbers
    if ( Vec_IntSize(p->vTtNums) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( p->vTtNums, Gia_ManObjNum(p), 0 );
    // collect internal nodes
    pRoot = Gia_ObjIsCo(pObj) ? Gia_ObjFanin0(pObj) : pObj;
    Gia_ObjCollectInternal( p, pRoot );
    // extend TT storage
    if ( Vec_WrdSize(p->vTtMemory) < p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2) )
        Vec_WrdFillExtra( p->vTtMemory, p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2), 0 );
    // compute the truth table for internal nodes
    Gia_ManForEachObjVec( p->vTtNodes, p, pTemp, i )
    {
        pTemp->fMark0 = 0; // unmark nodes marked by Gia_ObjCollectInternal()
        pTruth  = Gla_ObjTruthNode(p, pTemp);
        pTruthL = pTruth + p->nTtWords;
        pTruth0 = Gia_ObjIsAnd(Gia_ObjFanin0(pTemp)) ? Gla_ObjTruthNode(p, Gia_ObjFanin0(pTemp)) : Gla_ObjTruthElem(p, Gia_ObjCioId(Gia_ObjFanin0(pTemp)) );
        pTruth1 = Gia_ObjIsAnd(Gia_ObjFanin1(pTemp)) ? Gla_ObjTruthNode(p, Gia_ObjFanin1(pTemp)) : Gla_ObjTruthElem(p, Gia_ObjCioId(Gia_ObjFanin1(pTemp)) );
        if ( Gia_ObjFaninC0(pTemp) )
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ &  *pTruth1++;
        }
        else
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ &  *pTruth1++;
        }
    }
    // compute the final table
    if ( Gia_ObjIsConst0(pRoot) )
        pTruth = Gla_ObjTruthConst0( p, Gla_ObjTruthFree1(p) );
    else if ( Gia_ObjIsPi(p, pRoot) )
        pTruth = Gla_ObjTruthElem( p, Gia_ObjCioId(pRoot) );
    else if ( Gia_ObjIsAnd(pRoot) )
        pTruth = Gla_ObjTruthNode( p, pRoot );
    else
        pTruth = NULL;
    return Gla_ObjTruthDup( p, Gla_ObjTruthFree2(p), pTruth, Gia_ObjIsCo(pObj) && Gia_ObjFaninC0(pObj) );
}